

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::Parser::writeToStream(Parser *this,ostream *os)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  long lVar5;
  unsigned_long *puVar6;
  Column *this_00;
  Column *this_01;
  ostream *in_RSI;
  long in_RDI;
  Columns row;
  HelpColumns *cols_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  *__range3_1;
  HelpColumns *cols;
  iterator __end3;
  iterator __begin3;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  *__range3;
  size_t optWidth;
  size_t consoleWidth;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_> rows
  ;
  Arg *arg;
  const_iterator __end4;
  const_iterator __begin4;
  vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_> *__range4;
  bool first;
  bool required;
  ParserRefImpl<Catch::clara::detail::Arg> *in_stack_fffffffffffffdc8;
  Column *in_stack_fffffffffffffdd0;
  Column *in_stack_fffffffffffffdd8;
  vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
  *in_stack_fffffffffffffde0;
  Column *in_stack_fffffffffffffdf0;
  Column *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe10;
  Columns *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  Parser *in_stack_fffffffffffffe68;
  __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
  local_108;
  undefined1 *local_100;
  ulong local_f8;
  unsigned_long local_f0;
  reference local_e8;
  HelpColumns *local_e0;
  __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
  local_d8;
  undefined1 *local_d0;
  pointer local_c8;
  ulong local_c0;
  undefined1 local_b8 [24];
  Column local_a0;
  __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
  local_70;
  long local_68;
  byte local_5e;
  byte local_5d;
  string local_50 [32];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  ExeName::name_abi_cxx11_((ExeName *)in_stack_fffffffffffffdd8);
  bVar1 = ::std::__cxx11::string::empty();
  ::std::__cxx11::string::~string(local_30);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    poVar4 = ::std::operator<<(local_10,"usage:\n");
    poVar4 = ::std::operator<<(poVar4,"  ");
    in_stack_fffffffffffffe08 = local_50;
    ExeName::name_abi_cxx11_((ExeName *)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffe10 = ::std::operator<<(poVar4,in_stack_fffffffffffffe08);
    ::std::operator<<(in_stack_fffffffffffffe10," ");
    ::std::__cxx11::string::~string(local_50);
    local_5d = 1;
    local_5e = 1;
    local_68 = in_RDI + 0x48;
    local_70._M_current =
         (Arg *)std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::
                begin((vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                       *)in_stack_fffffffffffffdc8);
    local_a0.m_initialIndent =
         (size_t)std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                 ::end((vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                        *)in_stack_fffffffffffffdc8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                               *)in_stack_fffffffffffffdd0,
                              (__normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                               *)in_stack_fffffffffffffdc8), bVar2) {
      local_a0.m_indent =
           (size_t)__gnu_cxx::
                   __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                   ::operator*(&local_70);
      if ((local_5e & 1) == 0) {
        ::std::operator<<(local_10," ");
      }
      else {
        local_5e = 0;
      }
      bVar2 = ParserRefImpl<Catch::clara::detail::Arg>::isOptional
                        ((ParserRefImpl<Catch::clara::detail::Arg> *)local_a0.m_indent);
      if ((bVar2) && ((local_5d & 1) != 0)) {
        ::std::operator<<(local_10,"[");
        local_5d = 0;
      }
      poVar4 = ::std::operator<<(local_10,"<");
      in_stack_fffffffffffffdf0 = &local_a0;
      ParserRefImpl<Catch::clara::detail::Arg>::hint_abi_cxx11_(in_stack_fffffffffffffdc8);
      in_stack_fffffffffffffdf8 =
           (Column *)::std::operator<<(poVar4,(string *)in_stack_fffffffffffffdf0);
      ::std::operator<<((ostream *)in_stack_fffffffffffffdf8,">");
      ::std::__cxx11::string::~string((string *)&local_a0);
      iVar3 = (*(((ComposableParserImpl<Catch::clara::detail::Arg> *)local_a0.m_indent)->
                super_ParserBase)._vptr_ParserBase[4])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        ::std::operator<<(local_10," ... ");
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
      ::operator++(&local_70);
    }
    if ((local_5d & 1) == 0) {
      ::std::operator<<(local_10,"]");
    }
    bVar2 = std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::
            empty(in_stack_fffffffffffffde0);
    if (!bVar2) {
      ::std::operator<<(local_10," options");
    }
    poVar4 = ::std::operator<<(local_10,"\n\nwhere options are:");
    ::std::ostream::operator<<(poVar4,::std::endl<char,std::char_traits<char>>);
  }
  getHelpColumns(in_stack_fffffffffffffe68);
  local_c0 = 0x50;
  local_c8 = (pointer)0x0;
  local_d0 = local_b8;
  local_d8._M_current =
       (HelpColumns *)
       std::
       vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
       ::begin((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                *)in_stack_fffffffffffffdc8);
  local_e0 = (HelpColumns *)
             std::
             vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
             ::end((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                    *)in_stack_fffffffffffffdc8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                             *)in_stack_fffffffffffffdc8), bVar2) {
    local_e8 = __gnu_cxx::
               __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
               ::operator*(&local_d8);
    lVar5 = ::std::__cxx11::string::size();
    local_f0 = lVar5 + 2;
    puVar6 = std::max<unsigned_long>((unsigned_long *)&local_c8,&local_f0);
    local_c8 = (pointer)*puVar6;
    __gnu_cxx::
    __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
    ::operator++(&local_d8);
  }
  local_f8 = local_c0 >> 1;
  this_00 = (Column *)std::min<unsigned_long>((unsigned_long *)&local_c8,&local_f8);
  local_c8 = (((_Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                *)&this_00->m_strings)->_M_impl).super__Vector_impl_data._M_start;
  local_100 = local_b8;
  local_108._M_current =
       (HelpColumns *)
       std::
       vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
       ::begin((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                *)in_stack_fffffffffffffdc8);
  std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  ::end((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
         *)in_stack_fffffffffffffdc8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                             *)in_stack_fffffffffffffdc8), bVar2) {
    __gnu_cxx::
    __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
    ::operator*(&local_108);
    TextFlow::Column::Column(this_00,(string *)in_stack_fffffffffffffdd8);
    this_01 = TextFlow::Column::width(in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffdd8 = TextFlow::Column::indent(this_01,2);
    TextFlow::Spacer::Spacer((Spacer *)in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08);
    TextFlow::Column::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    TextFlow::Column::Column(this_00,(string *)in_stack_fffffffffffffdd8);
    TextFlow::Column::width(in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8);
    TextFlow::Columns::operator+((Columns *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    TextFlow::Column::~Column((Column *)0x2cc817);
    TextFlow::Columns::~Columns((Columns *)0x2cc824);
    TextFlow::Spacer::~Spacer((Spacer *)0x2cc831);
    TextFlow::Column::~Column((Column *)0x2cc83e);
    in_stack_fffffffffffffdd0 =
         (Column *)TextFlow::operator<<(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    ::std::ostream::operator<<(in_stack_fffffffffffffdd0,::std::endl<char,std::char_traits<char>>);
    TextFlow::Columns::~Columns((Columns *)0x2cc87a);
    __gnu_cxx::
    __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
    ::operator++(&local_108);
  }
  std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  ::~vector((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
             *)this_00);
  return;
}

Assistant:

void writeToStream( std::ostream &os ) const {
            if (!m_exeName.name().empty()) {
                os << "usage:\n" << "  " << m_exeName.name() << " ";
                bool required = true, first = true;
                for( auto const &arg : m_args ) {
                    if (first)
                        first = false;
                    else
                        os << " ";
                    if( arg.isOptional() && required ) {
                        os << "[";
                        required = false;
                    }
                    os << "<" << arg.hint() << ">";
                    if( arg.cardinality() == 0 )
                        os << " ... ";
                }
                if( !required )
                    os << "]";
                if( !m_options.empty() )
                    os << " options";
                os << "\n\nwhere options are:" << std::endl;
            }

            auto rows = getHelpColumns();
            size_t consoleWidth = CATCH_CLARA_CONFIG_CONSOLE_WIDTH;
            size_t optWidth = 0;
            for( auto const &cols : rows )
                optWidth = (std::max)(optWidth, cols.left.size() + 2);

            optWidth = (std::min)(optWidth, consoleWidth/2);

            for( auto const &cols : rows ) {
                auto row =
                        TextFlow::Column( cols.left ).width( optWidth ).indent( 2 ) +
                        TextFlow::Spacer(4) +
                        TextFlow::Column( cols.right ).width( consoleWidth - 7 - optWidth );
                os << row << std::endl;
            }
        }